

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# overlay.tpl.h
# Opt level: O0

void __thiscall
r_exec::Controller::__take_input<r_exec::TopLevelMDLController>(Controller *this,View *input)

{
  ReductionJob<r_exec::TopLevelMDLController> *this_00;
  _Mem *this_01;
  ReductionJob<r_exec::TopLevelMDLController> *j;
  View *input_local;
  Controller *this_local;
  
  this_00 = (ReductionJob<r_exec::TopLevelMDLController> *)operator_new(0x28);
  ReductionJob<r_exec::TopLevelMDLController>::ReductionJob
            (this_00,input,(TopLevelMDLController *)this);
  this_01 = _Mem::Get();
  _Mem::pushReductionJob(this_01,(_ReductionJob *)this_00);
  return;
}

Assistant:

void Controller::__take_input(r_exec::View *input)   // utility: to be called by sub-classes.
{
    ReductionJob<C> *j = new ReductionJob<C>(input/*_view*/, (C *)this);
    _Mem::Get()->pushReductionJob(j);
}